

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.cpp
# Opt level: O3

void duckdb::TemplatedGenerateSequence<short>
               (Vector *result,idx_t count,SelectionVector *sel,int64_t start,int64_t increment)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  InternalException *this;
  idx_t iVar3;
  idx_t iVar4;
  string local_50;
  
  if ((start < 0x8000) && (increment < 0x8000)) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    if (count != 0) {
      pdVar1 = result->data;
      psVar2 = sel->sel_vector;
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        if (psVar2 != (sel_t *)0x0) {
          iVar4 = (idx_t)psVar2[iVar3];
        }
        *(short *)(pdVar1 + iVar4 * 2) = (short)iVar4 * (short)increment + (short)start;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Sequence start or increment out of type range","");
  InternalException::InternalException(this,&local_50);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemplatedGenerateSequence(Vector &result, idx_t count, const SelectionVector &sel, int64_t start,
                               int64_t increment) {
	D_ASSERT(result.GetType().IsNumeric());
	if (start > NumericLimits<T>::Maximum() || increment > NumericLimits<T>::Maximum()) {
		throw InternalException("Sequence start or increment out of type range");
	}
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<T>(result);
	auto value = static_cast<uint64_t>(start);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		result_data[idx] = static_cast<T>(value + static_cast<uint64_t>(increment) * idx);
	}
}